

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

CTcPrsNode * __thiscall CTPNSymBase::fold_constants(CTPNSymBase *this,CTcPrsSymtab *symtab)

{
  int iVar1;
  CTcSymbol *pCVar2;
  undefined4 extraout_var;
  CTcPrsSymtab *in_RDI;
  CTcPrsNode *ret;
  CTcSymbol *sym;
  textchar_t *in_stack_ffffffffffffffb8;
  CTcPrsSymtab *local_8;
  
  (*in_RDI->_vptr_CTcPrsSymtab[0xc])();
  (*in_RDI->_vptr_CTcPrsSymtab[0xd])();
  pCVar2 = CTcPrsSymtab::find(in_RDI,in_stack_ffffffffffffffb8,0x25ae4a);
  local_8 = in_RDI;
  if (pCVar2 != (CTcSymbol *)0x0) {
    iVar1 = (*(pCVar2->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry.
              _vptr_CVmHashEntry[3])();
    local_8 = in_RDI;
    if ((CTcPrsSymtab *)CONCAT44(extraout_var,iVar1) != (CTcPrsSymtab *)0x0) {
      local_8 = (CTcPrsSymtab *)CONCAT44(extraout_var,iVar1);
    }
  }
  return (CTcPrsNode *)local_8;
}

Assistant:

CTcPrsNode *CTPNSymBase::fold_constants(CTcPrsSymtab *symtab)
{
    CTcSymbol *sym;
    CTcPrsNode *ret;

    /*
     *   Look up my symbol.  At this stage, don't assume a definition;
     *   merely look to see if it's already known.  We don't have enough
     *   information to determine how we should define the symbol, so
     *   leave it undefined until code generation if it's not already
     *   known.  
     */
    sym = symtab->find(get_sym_text(), get_sym_text_len());
    if (sym != 0)
    {
        /* ask the symbol to do the folding */
        ret = sym->fold_constant();

        /* if that succeeded, return it; otherwise, return unchanged */
        return (ret != 0 ? ret : this);
    }
    else
    {
        /* not defined - return myself unchanged */
        return this;
    }
}